

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

RELEASED_HANDLE released_create(void)

{
  RELEASED_HANDLE __ptr;
  AMQP_VALUE pAVar1;
  
  __ptr = (RELEASED_HANDLE)malloc(8);
  if (__ptr != (RELEASED_HANDLE)0x0) {
    pAVar1 = amqpvalue_create_composite_with_ulong_descriptor(0x26);
    __ptr->composite_value = pAVar1;
    if (pAVar1 != (AMQP_VALUE)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (RELEASED_HANDLE)0x0;
}

Assistant:

RELEASED_HANDLE released_create(void)
{
    RELEASED_INSTANCE* released_instance = (RELEASED_INSTANCE*)malloc(sizeof(RELEASED_INSTANCE));
    if (released_instance != NULL)
    {
        released_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(38);
        if (released_instance->composite_value == NULL)
        {
            free(released_instance);
            released_instance = NULL;
        }
    }

    return released_instance;
}